

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O2

void __thiscall FDynamicColormap::BuildLights(FDynamicColormap *this)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  BYTE *pBVar4;
  BYTE BVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  PalEntry colors [256];
  PalEntry basecolors [256];
  long local_850;
  PalEntry local_838 [256];
  PalEntry local_438 [258];
  
  if (this->Maps != (BYTE *)0x0) {
    bVar1 = (this->Color).field_0.field_0.r;
    bVar2 = (this->Color).field_0.field_0.g;
    uVar3 = (this->Color).field_0.d;
    iVar6 = (this->Desaturate << 8) / 0xff;
    iVar12 = -iVar6;
    if (-1 < this->Desaturate) {
      iVar12 = iVar6;
    }
    if (iVar12 == 0) {
      memcpy(local_838 + 0x100,&GPalette,0x400);
    }
    else {
      iVar6 = 0x100 - iVar12;
      for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
        uVar7 = (uint)GPalette.BaseColors[lVar9].field_0.field_0.r;
        uVar8 = (uint)GPalette.BaseColors[lVar9].field_0.field_0.g;
        uVar10 = (uint)GPalette.BaseColors[lVar9].field_0.field_0.b;
        iVar13 = (uVar10 * 0x25 + uVar8 * 0x8f + uVar7 * 0x4d >> 8) * iVar12;
        local_838[lVar9 + 0x100].field_0.field_0.r = (BYTE)(uVar7 * iVar6 + iVar13 >> 8);
        local_838[lVar9 + 0x100].field_0.field_0.g = (BYTE)(uVar8 * iVar6 + iVar13 >> 8);
        local_838[lVar9 + 0x100].field_0.field_0.b = (BYTE)(uVar10 * iVar6 + iVar13 >> 8);
        local_838[lVar9 + 0x100].field_0.field_0.a = '\0';
      }
    }
    local_850 = 0;
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
      DoBlending(local_838 + 0x100,local_838,0x100,(uint)(this->Fade).field_0.field_0.r,
                 (uint)(this->Fade).field_0.field_0.g,(uint)(this->Fade).field_0.field_0.b,
                 (int)lVar9 * 8);
      pBVar4 = this->Maps;
      if ((this->Color).field_0.d == 0xffffff) {
        for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
          BVar5 = FColorMatcher::Pick(&ColorMatcher,(uint)local_838[lVar11].field_0.field_0.r,
                                      (uint)local_838[lVar11].field_0.field_0.g,
                                      (uint)local_838[lVar11].field_0.field_0.b);
          pBVar4[lVar11 + local_850] = BVar5;
        }
      }
      else {
        for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
          BVar5 = FColorMatcher::Pick(&ColorMatcher,
                                      (uint)local_838[lVar11].field_0.field_0.r *
                                      (((uint)bVar1 << 8) / 0xff) >> 8,
                                      (uint)local_838[lVar11].field_0.field_0.g *
                                      (((uint)bVar2 << 8) / 0xff) >> 8,
                                      (uint)local_838[lVar11].field_0.field_0.b *
                                      (((uVar3 & 0xff) << 8) / 0xff) >> 8);
          pBVar4[lVar11 + local_850] = BVar5;
        }
      }
      local_850 = local_850 + 0x100;
    }
  }
  return;
}

Assistant:

void FDynamicColormap::BuildLights ()
{
	int l, c;
	int lr, lg, lb, ld, ild;
	PalEntry colors[256], basecolors[256];
	BYTE *shade;

	if (Maps == NULL)
		return;

	// Scale light to the range 0-256, so we can avoid
	// dividing by 255 in the bottom loop.
	lr = Color.r*256/255;
	lg = Color.g*256/255;
	lb = Color.b*256/255;
	ld = Desaturate*256/255;
	if (ld < 0)	// No negative desaturations, please.
	{
		ld = -ld;
	}
	ild = 256-ld;

	if (ld == 0)
	{
		memcpy (basecolors, GPalette.BaseColors, sizeof(basecolors));
	}
	else
	{
		// Desaturate the palette before lighting it.
		for (c = 0; c < 256; c++)
		{
			int r = GPalette.BaseColors[c].r;
			int g = GPalette.BaseColors[c].g;
			int b = GPalette.BaseColors[c].b;
			int intensity = ((r * 77 + g * 143 + b * 37) >> 8) * ld;
			basecolors[c].r = (r*ild + intensity) >> 8;
			basecolors[c].g = (g*ild + intensity) >> 8;
			basecolors[c].b = (b*ild + intensity) >> 8;
			basecolors[c].a = 0;
		}
	}

	// build normal (but colored) light mappings
	for (l = 0; l < NUMCOLORMAPS; l++)
	{
		DoBlending (basecolors, colors, 256,
			Fade.r, Fade.g, Fade.b, l * (256 / NUMCOLORMAPS));

		shade = Maps + 256*l;
		if ((DWORD)Color == MAKERGB(255,255,255))
		{ // White light, so we can just pick the colors directly
			for (c = 0; c < 256; c++)
			{
				*shade++ = ColorMatcher.Pick (colors[c].r, colors[c].g, colors[c].b);
			}
		}
		else
		{ // Colored light, so do the (slightly) slower thing
			for (c = 0; c < 256; c++)
			{
				*shade++ = ColorMatcher.Pick (
					(colors[c].r*lr)>>8,
					(colors[c].g*lg)>>8,
					(colors[c].b*lb)>>8);
			}
		}
	}
}